

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_stream.c
# Opt level: O2

void stream_read_alloc_cb(uv_handle_t *handle,size_t suggested_size,uv_buf_t *buf)

{
  uint uVar1;
  
  if (handle[0x2f].next_closing != (uv_handle_t *)0x0) {
    (*(code *)handle[0x2f].next_closing)();
    return;
  }
  uVar1 = *(uint *)(handle[0x2d].handle_queue + 1);
  buf->base = (char *)((long)handle[2].handle_queue + (ulong)uVar1 + 0x28);
  buf->len = (ulong)(0x1000 - uVar1);
  return;
}

Assistant:

static void stream_read_alloc_cb(
    uv_handle_t *handle,
    size_t suggested_size,
    uv_buf_t *buf)
{
    struct asterism_stream_s *stream = __CONTAINER_PTR(struct asterism_stream_s, socket, handle);
    if (stream->_alloc_cb)
    {
        stream->_alloc_cb(handle, suggested_size, buf);
    }
    else
    {
        buf->base = stream->buffer + stream->buffer_len;
        buf->len = ASTERISM_TCP_BLOCK_SIZE - stream->buffer_len;
    }
}